

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr.c
# Opt level: O2

int Saig_ManDupCompare(Aig_Obj_t **pp1,Aig_Obj_t **pp2)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = Aig_ObjToLit(*pp1);
  uVar2 = Aig_ObjToLit(*pp2);
  uVar3 = 0xffffffff;
  if (uVar2 <= uVar1) {
    uVar3 = (uint)(uVar1 != uVar2);
  }
  return uVar3;
}

Assistant:

int Saig_ManDupCompare( Aig_Obj_t ** pp1, Aig_Obj_t ** pp2 )
{
    int Diff = Aig_ObjToLit(*pp1) - Aig_ObjToLit(*pp2);
    if ( Diff < 0 )
        return -1;
    if ( Diff > 0 ) 
        return 1;
    return 0; 
}